

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O2

void __thiscall lambda::parse_from::helper::unexpected_thing(helper *this)

{
  Parse_error *this_00;
  int iVar1;
  Shared_string SStack_48;
  Shared_string local_30;
  
  iVar1 = std::istream::peek();
  this_00 = (Parse_error *)__cxa_allocate_exception(0x20);
  if (iVar1 == -1) {
    ublib::Shared_string::Shared_string(&local_30,"unexpected end of file");
    Parse_error::Parse_error(this_00,&local_30);
    __cxa_throw(this_00,&Parse_error::typeinfo,Parse_error::~Parse_error);
  }
  ublib::Shared_string::Shared_string(&SStack_48,"unexpected character");
  Parse_error::Parse_error(this_00,&SStack_48);
  __cxa_throw(this_00,&Parse_error::typeinfo,Parse_error::~Parse_error);
}

Assistant:

[[noreturn]] void unexpected_thing() {
      if (inp.peek() == eof) {
        throw Parse_error("unexpected end of file");
      } else {
        throw Parse_error("unexpected character");
      }
    }